

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::testAndParseUri(Parser *this,QString *uri)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->index;
  bVar2 = testFunction(this);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_0054680f;
  }
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  bVar2 = parseFunction(this,(QString *)&local_38,(QString *)&local_58);
  if (bVar2) {
    iVar3 = QString::compare((QLatin1String *)&local_38,3);
    if (iVar3 != 0) goto LAB_005467f3;
    QString::operator=(uri,(QString *)&local_58);
    removeOptionalQuotes(uri);
    bVar2 = true;
  }
  else {
LAB_005467f3:
    this->index = iVar1;
    bVar2 = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
LAB_0054680f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::testAndParseUri(QString *uri)
{
    const int rewind = index;
    if (!testFunction()) return false;

    QString name, args;
    if (!parseFunction(&name, &args)) {
        index = rewind;
        return false;
    }
    if (name.compare("url"_L1, Qt::CaseInsensitive) != 0) {
        index = rewind;
        return false;
    }
    *uri = args;
    removeOptionalQuotes(uri);
    return true;
}